

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t _elemsize;
  _func_int *p_Var6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  _func_int **pp_Var10;
  Layer *pLVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int *piVar15;
  int j;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  int _w;
  int iVar22;
  int _w_00;
  ulong uVar23;
  ulong uVar24;
  undefined4 *puVar25;
  int iVar26;
  long lVar27;
  void *pvVar28;
  ulong uVar29;
  undefined4 *puVar30;
  int j_1;
  long lVar31;
  int _w_01;
  ulong uVar32;
  undefined4 *puVar33;
  long local_1c0;
  long local_1b8;
  long local_180;
  long local_160;
  Mat local_118;
  Mat local_c8;
  Option opt_g;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var6 = this->_vptr_Convolution_x86[-3];
  iVar3 = *(int *)(p_Var6 + 0x34 + (long)&(this->weight_winograd23_data).data);
  iVar4 = *(int *)(p_Var6 + 0x44 + (long)&(this->weight_winograd23_data).data);
  uVar5 = *(uint *)(p_Var6 + 0x3c + (long)&(this->weight_winograd23_data).data);
  iVar22 = (iVar3 + -1) * uVar5 + 1;
  iVar12 = (iVar1 - iVar22) / iVar4;
  _w = iVar12 + 1;
  Mat::create(top_blob,_w,(iVar2 - iVar22) / iVar4 + 1,
              *(int *)(p_Var6 + 0x30 + (long)&(this->weight_winograd23_data).data),_elemsize,
              opt->blob_allocator);
  iVar22 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_118.cstep = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    uVar23 = 0;
    if (0 < (int)uVar5) {
      uVar23 = (ulong)uVar5;
    }
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    local_1b8 = 0;
    local_1c0 = 0;
    for (uVar18 = 0; uVar18 != uVar23; uVar18 = uVar18 + 1) {
      local_180 = local_1b8;
      local_160 = local_1c0;
      for (uVar17 = 0; uVar17 != uVar5; uVar17 = uVar17 + 1) {
        uVar32 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar17) / (long)(int)uVar5;
        uVar20 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar18) / (long)(int)uVar5;
        _w_01 = (int)uVar32;
        iVar22 = (_w_01 - iVar3) / iVar4;
        iVar26 = (int)uVar20;
        iVar13 = (iVar26 - iVar3) / iVar4;
        Mat::create(&local_c8,_w_01,iVar26,bottom_blob->c,_elemsize,opt->workspace_allocator);
        if ((local_c8.data == (void *)0x0) || ((long)local_c8.c * local_c8.cstep == 0)) {
LAB_001a3941:
          iVar22 = -100;
          goto LAB_001a3945;
        }
        _w_00 = iVar22 + 1;
        Mat::create(&local_118,_w_00,iVar13 + 1,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                            (long)&(this->weight_winograd23_data).data),_elemsize,
                    opt->workspace_allocator);
        if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0))
        goto LAB_001a3941;
        uVar32 = uVar32 & 0xffffffff;
        if (_w_01 < 1) {
          uVar32 = 0;
        }
        uVar20 = uVar20 & 0xffffffff;
        if (iVar26 < 1) {
          uVar20 = 0;
        }
        uVar14 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar14 = 0;
        }
        pvVar19 = local_c8.data;
        for (uVar24 = 0; uVar24 != uVar14; uVar24 = uVar24 + 1) {
          sVar7 = bottom_blob->cstep;
          pvVar8 = bottom_blob->data;
          sVar9 = bottom_blob->elemsize;
          iVar26 = 0;
          pvVar28 = pvVar19;
          for (uVar29 = 0; uVar29 != uVar20; uVar29 = uVar29 + 1) {
            puVar25 = (undefined4 *)
                      ((long)pvVar8 + (long)iVar26 * 4 + sVar7 * sVar9 * uVar24 + local_160);
            for (uVar16 = 0; uVar32 != uVar16; uVar16 = uVar16 + 1) {
              *(undefined4 *)((long)pvVar28 + uVar16 * 4) = *puVar25;
              puVar25 = puVar25 + (int)uVar5;
            }
            pvVar28 = (void *)((long)pvVar28 + (long)_w_01 * 4);
            iVar26 = iVar26 + uVar5 * iVar1;
          }
          pvVar19 = (void *)((long)pvVar19 +
                            local_c8.cstep *
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        }
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
        opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_reserved_6 = opt->use_reserved_6;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = local_118.allocator;
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&local_c8,&local_118,&opt_g);
        pp_Var10 = this->_vptr_Convolution_x86;
        sVar7 = top_blob->cstep;
        puVar25 = (undefined4 *)((long)top_blob->data + local_180);
        sVar9 = top_blob->elemsize;
        for (lVar27 = 0;
            lVar27 < *(int *)(pp_Var10[-3] + 0x30 + (long)&(this->weight_winograd23_data).data);
            lVar27 = lVar27 + 1) {
          pvVar19 = (void *)(local_118.cstep *
                             CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) *
                             lVar27 + (long)local_118.data);
          puVar30 = puVar25;
          for (lVar21 = 0; lVar21 <= iVar13; lVar21 = lVar21 + 1) {
            puVar33 = puVar30;
            for (lVar31 = 0; lVar31 <= iVar22; lVar31 = lVar31 + 1) {
              *puVar33 = *(undefined4 *)((long)pvVar19 + lVar31 * 4);
              puVar33 = puVar33 + (int)uVar5;
            }
            pvVar19 = (void *)((long)pvVar19 + (long)_w_00 * 4);
            puVar30 = puVar30 + (int)(_w * uVar5);
          }
          puVar25 = (undefined4 *)((long)puVar25 + sVar7 * sVar9);
        }
        local_160 = local_160 + 4;
        local_180 = local_180 + 4;
      }
      local_1c0 = local_1c0 + (long)iVar1 * 4;
      local_1b8 = local_1b8 + (long)iVar12 * 4 + 4;
    }
    pLVar11 = this->activation;
    iVar22 = 0;
    if (pLVar11 != (Layer *)0x0) {
      (*pLVar11->_vptr_Layer[9])(pLVar11,top_blob,opt);
    }
LAB_001a3945:
    piVar15 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar15 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar22;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}